

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_read_s16(drwav *pWav,drwav_uint64 samplesToRead,drwav_int16 *pBufferOut)

{
  drwav_uint64 dVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  size_t sVar8;
  drwav_uint64 dVar9;
  drwav_int32 *pdVar10;
  drwav_int16 *pdVar11;
  drwav_uint64 dVar12;
  drwav_uint32 *pdVar13;
  long lVar14;
  drwav_uint32 dVar15;
  drwav_int32 dVar16;
  drwav_int32 dVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  short sStack_78;
  byte bStack_76;
  short sStack_74;
  byte bStack_72;
  drwav_uint64 dStack_70;
  drwav_uint64 dStack_68;
  drwav_uint32 *pdStack_60;
  long lStack_58;
  drwav_int16 *pdStack_50;
  drwav_uint32 *pdStack_48;
  drwav_int32 *pdStack_40;
  ulong uStack_38;
  
  if (pBufferOut != (drwav_int16 *)0x0 && (samplesToRead != 0 && pWav != (drwav *)0x0)) {
    switch(pWav->translatedFormatTag) {
    case 1:
      dVar9 = drwav_read_s16__pcm(pWav,samplesToRead,pBufferOut);
      return dVar9;
    case 2:
      dVar9 = drwav_read_s16__msadpcm(pWav,samplesToRead,pBufferOut);
      return dVar9;
    case 3:
      dVar9 = drwav_read_s16__ieee(pWav,samplesToRead,pBufferOut);
      return dVar9;
    case 4:
    case 5:
      break;
    case 6:
      dVar9 = drwav_read_s16__alaw(pWav,samplesToRead,pBufferOut);
      return dVar9;
    case 7:
      dVar9 = drwav_read_s16__mulaw(pWav,samplesToRead,pBufferOut);
      return dVar9;
    default:
      if (pWav->translatedFormatTag == 0x11) {
        if (samplesToRead == 0) {
          return 0;
        }
        pdVar13 = &(pWav->ima).cachedSampleCount;
        pdStack_40 = (pWav->ima).cachedSamples;
        dVar9 = 0;
        do {
          if (pWav->totalSampleCount <= (pWav->compressed).iCurrentSample) {
            return dVar9;
          }
          dVar15 = *pdVar13;
          if ((dVar15 == 0) && (dVar15 = 0, (pWav->ima).bytesRemainingInBlock == 0)) {
            if (pWav->channels == 1) {
              sVar8 = (*pWav->onRead)(pWav->pUserData,&sStack_78,4);
              if (sVar8 != 4) {
                return dVar9;
              }
              (pWav->ima).bytesRemainingInBlock = (pWav->fmt).blockAlign - 4;
              (pWav->ima).predictor[0] = (int)sStack_78;
              (pWav->ima).stepIndex[0] = (uint)bStack_76;
              (pWav->ima).cachedSamples[0xf] = (int)sStack_78;
              (pWav->ima).cachedSampleCount = 1;
              dVar15 = 1;
            }
            else {
              sVar8 = (*pWav->onRead)(pWav->pUserData,&sStack_78,8);
              if (sVar8 != 8) {
                return dVar9;
              }
              (pWav->ima).bytesRemainingInBlock = (pWav->fmt).blockAlign - 8;
              (pWav->ima).predictor[0] = (int)sStack_78;
              (pWav->ima).stepIndex[0] = (uint)bStack_76;
              (pWav->ima).predictor[1] = (int)sStack_74;
              (pWav->ima).stepIndex[1] = (uint)bStack_72;
              (pWav->ima).cachedSamples[0xe] = (int)sStack_78;
              (pWav->ima).cachedSamples[0xf] = (int)sStack_74;
              (pWav->ima).cachedSampleCount = 2;
              dVar15 = 2;
            }
          }
          uVar19 = (ulong)dVar15;
          dStack_70 = samplesToRead - uVar19;
          dVar1 = uVar19 + dVar9;
          dVar12 = 0;
          pdVar11 = pBufferOut;
          while (dVar15 = dVar15 - 1, dVar12 != uVar19) {
            uVar6 = (pWav->compressed).iCurrentSample;
            if (pWav->totalSampleCount <= uVar6) {
              dVar9 = dVar9 + dVar12;
              samplesToRead = samplesToRead - dVar12;
              pBufferOut = pdVar11;
              goto LAB_0010b42a;
            }
            pBufferOut[dVar12] = (drwav_int16)pdVar13[dVar12 - uVar19];
            (pWav->ima).cachedSampleCount = dVar15;
            pdVar11 = pdVar11 + 1;
            (pWav->compressed).iCurrentSample = uVar6 + 1;
            dVar12 = dVar12 + 1;
            if (samplesToRead == dVar12) {
              return samplesToRead + dVar9;
            }
          }
          dVar9 = dVar1;
          samplesToRead = dStack_70;
          pBufferOut = pdVar11;
          if (((pWav->ima).bytesRemainingInBlock != 0) &&
             (uVar3 = pWav->channels, (pWav->ima).cachedSampleCount = (uint)uVar3 * 8, uVar3 != 0))
          {
            lStack_58 = 0x10;
            uVar19 = 0;
            dStack_68 = dVar1;
            pdStack_60 = pdVar13;
            pdStack_50 = pdVar11;
            pdStack_48 = pdVar13;
            do {
              sVar8 = (*pWav->onRead)(pWav->pUserData,&sStack_78,4);
              if (sVar8 != 4) {
                return dStack_68;
              }
              (pWav->ima).bytesRemainingInBlock = (pWav->ima).bytesRemainingInBlock - 4;
              uVar3 = pWav->channels;
              uStack_38 = (ulong)uVar3;
              pdVar10 = pdStack_40 + lStack_58 + uStack_38;
              lVar14 = 0;
              pdVar13 = pdStack_60;
              do {
                bVar2 = *(byte *)((long)&sStack_78 + lVar14);
                uVar18 = bVar2 & 0xf;
                iVar4 = (pWav->ima).stepIndex[uVar19];
                uVar5 = drwav_read_s16__ima::stepTable[iVar4];
                iVar7 = ((int)(uVar18 << 0x1d) >> 0x1f & uVar5) +
                        ((int)uVar5 >> 1 & (int)(uVar18 << 0x1e) >> 0x1f) +
                        ((int)uVar5 >> 2 & -(bVar2 & 1)) + ((int)uVar5 >> 3);
                iVar20 = -iVar7;
                if ((byte)uVar18 < 8) {
                  iVar20 = iVar7;
                }
                dVar15 = iVar20 + (pWav->ima).predictor[uVar19];
                if (0x7ffe < (int)dVar15) {
                  dVar15 = 0x7fff;
                }
                if ((int)dVar15 < -0x7fff) {
                  dVar15 = 0xffff8000;
                }
                (pWav->ima).predictor[uVar19] = dVar15;
                dVar16 = iVar4 + drwav_read_s16__ima::indexTable[uVar18];
                if (0x57 < dVar16) {
                  dVar16 = 0x58;
                }
                if (dVar16 < 1) {
                  dVar16 = 0;
                }
                (pWav->ima).stepIndex[uVar19] = dVar16;
                pdVar13[-(ulong)(pWav->ima).cachedSampleCount] = dVar15;
                iVar4 = (pWav->ima).stepIndex[uVar19];
                uVar5 = drwav_read_s16__ima::stepTable[iVar4];
                iVar7 = ((int)((uint)bVar2 << 0x19) >> 0x1f & uVar5) + ((int)uVar5 >> 3) +
                        ((int)uVar5 >> 2 & -(uint)((bVar2 >> 4 & 1) != 0)) +
                        ((int)uVar5 >> 1 & (int)((uint)bVar2 << 0x1a) >> 0x1f);
                iVar20 = -iVar7;
                if (-1 < (char)bVar2) {
                  iVar20 = iVar7;
                }
                dVar16 = iVar20 + (pWav->ima).predictor[uVar19];
                if (0x7ffe < dVar16) {
                  dVar16 = 0x7fff;
                }
                if (dVar16 < -0x7fff) {
                  dVar16 = -0x8000;
                }
                (pWav->ima).predictor[uVar19] = dVar16;
                dVar17 = iVar4 + drwav_read_s16__ima::indexTable[bVar2 >> 4];
                if (0x57 < dVar17) {
                  dVar17 = 0x58;
                }
                if (dVar17 < 1) {
                  dVar17 = 0;
                }
                (pWav->ima).stepIndex[uVar19] = dVar17;
                pdVar10[-(ulong)(pWav->ima).cachedSampleCount] = dVar16;
                lVar14 = lVar14 + 1;
                pdVar10 = pdVar10 + (ulong)uVar3 * 2;
                pdVar13 = pdVar13 + (ulong)uVar3 * 2;
              } while (lVar14 != 4);
              uVar19 = uVar19 + 1;
              lStack_58 = lStack_58 + 1;
              pdStack_60 = pdStack_60 + 1;
              dVar9 = dStack_68;
              samplesToRead = dStack_70;
              pBufferOut = pdStack_50;
              pdVar13 = pdStack_48;
            } while (uVar19 < uStack_38);
          }
LAB_0010b42a:
          if (samplesToRead == 0) {
            return dVar9;
          }
        } while( true );
      }
    }
  }
  return 0;
}

Assistant:

drwav_uint64 drwav_read_s16(drwav* pWav, drwav_uint64 samplesToRead, drwav_int16* pBufferOut)
{
    if (pWav == NULL || samplesToRead == 0 || pBufferOut == NULL) {
        return 0;
    }

    // Don't try to read more samples than can potentially fit in the output buffer.
    if (samplesToRead * sizeof(drwav_int16) > DRWAV_SIZE_MAX) {
        samplesToRead = DRWAV_SIZE_MAX / sizeof(drwav_int16);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_s16__pcm(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_s16__msadpcm(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_s16__ieee(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_s16__alaw(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_s16__mulaw(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_s16__ima(pWav, samplesToRead, pBufferOut);
    }

    return 0;
}